

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_free_page_element(nk_context *ctx,nk_page_element *elem)

{
  nk_size nVar1;
  
  if ((ctx->use_pool == 0) &&
     (nVar1 = (ctx->memory).size,
     elem + 1 == (nk_page_element *)((long)(ctx->memory).memory.ptr + nVar1))) {
    (ctx->memory).size = nVar1 - 0x200;
    return;
  }
  if (ctx->freelist != (nk_page_element *)0x0) {
    elem->next = ctx->freelist;
  }
  ctx->freelist = elem;
  return;
}

Assistant:

NK_LIB void
nk_free_page_element(struct nk_context *ctx, struct nk_page_element *elem)
{
/* we have a pool so just add to free list */
if (ctx->use_pool) {
nk_link_page_element_into_freelist(ctx, elem);
return;
}
/* if possible remove last element from back of fixed memory buffer */
{void *elem_end = (void*)(elem + 1);
void *buffer_end = (nk_byte*)ctx->memory.memory.ptr + ctx->memory.size;
if (elem_end == buffer_end)
ctx->memory.size -= sizeof(struct nk_page_element);
else nk_link_page_element_into_freelist(ctx, elem);}
}